

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytesinkutil.cpp
# Opt level: O0

UBool icu_63::ByteSinkUtil::appendChange
                (uint8_t *s,uint8_t *limit,char16_t *s16,int32_t s16Length,ByteSink *sink,
                Edits *edits,UErrorCode *errorCode)

{
  UBool UVar1;
  Edits *edits_local;
  ByteSink *sink_local;
  int32_t s16Length_local;
  char16_t *s16_local;
  uint8_t *limit_local;
  uint8_t *s_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((long)limit - (long)s < 0x80000000) {
      s_local._7_1_ = appendChange((int)limit - (int)s,s16,s16Length,sink,edits,errorCode);
    }
    else {
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      s_local._7_1_ = '\0';
    }
  }
  else {
    s_local._7_1_ = '\0';
  }
  return s_local._7_1_;
}

Assistant:

UBool
ByteSinkUtil::appendChange(const uint8_t *s, const uint8_t *limit,
                           const char16_t *s16, int32_t s16Length,
                           ByteSink &sink, Edits *edits, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return FALSE; }
    if ((limit - s) > INT32_MAX) {
        errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    }
    return appendChange((int32_t)(limit - s), s16, s16Length, sink, edits, errorCode);
}